

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compiler.cpp
# Opt level: O3

void __thiscall
Arithemtic_LocalReuse_Test::~Arithemtic_LocalReuse_Test(Arithemtic_LocalReuse_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Arithemtic, LocalReuse) {
	// let a = 0 while true { a = a + 1 a = a + 2}
	MOCK(
		BC3(BC_ADD_LN, 0, 0, 0),
		BC3(BC_ADD_LN, 0, 0, 1),
	);

	INS(IR_LOAD_STACK, 0, 0);
	INS(IR_LOAD_CONST, 0, 0);
	INS(IR_ADD, 1, 2);
	INS(IR_LOAD_CONST, 1, 0);
	INS(IR_ADD, 3, 4);
}